

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O1

bool Debug::getSourceLine(void *addr,String *file,int *line)

{
  usize *puVar1;
  ulong uVar2;
  Data *pDVar3;
  long lVar4;
  int iVar5;
  char *start_1;
  long *__ptr;
  Map<String,_String> *__nbytes;
  Data *pDVar6;
  usize uVar7;
  char *pcVar8;
  ulong length;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  Data *pDVar13;
  bool bVar14;
  Process process;
  void *relAddr;
  String addrStr;
  String cmd;
  String bin;
  String buf;
  void *addrs [1];
  Process local_1a0;
  String local_190;
  undefined8 local_168;
  String local_160;
  String local_138;
  String local_110;
  Map<String,_String> local_e8;
  void *local_30;
  
  local_30 = addr;
  __ptr = (long *)backtrace_symbols(&local_30,1);
  if (__ptr == (long *)0x0) {
    return false;
  }
  if (*__ptr == 0) {
    free(__ptr);
    return false;
  }
  uVar7 = 0xffffffffffffffff;
  do {
    lVar4 = uVar7 + 1;
    uVar7 = uVar7 + 1;
  } while (((char *)*__ptr)[lVar4] != '\0');
  String::String(&local_160,(char *)*__ptr,uVar7);
  free(__ptr);
  pcVar11 = (local_160.data)->str;
  pcVar8 = pcVar11 + (local_160.data)->len;
  do {
    pcVar8 = pcVar8 + -1;
    pcVar10 = (char *)0x0;
    if (pcVar8 < pcVar11) break;
    pcVar10 = pcVar8;
  } while (*pcVar8 != '[');
  pcVar8 = pcVar11 + (local_160.data)->len;
  do {
    pcVar8 = pcVar8 + -1;
    pcVar9 = (char *)0x0;
    if (pcVar8 < pcVar11) break;
    pcVar9 = pcVar8;
  } while (*pcVar8 != ']');
  bVar14 = false;
  if (((pcVar9 < pcVar10) || (bVar14 = false, pcVar10 == (char *)0x0)) || (pcVar9 == (char *)0x0))
  goto LAB_0010489e;
  pcVar8 = String::operator_cast_to_char_(&local_160);
  String::substr((String *)&local_e8,&local_160,(long)(pcVar10 + 1) - (long)pcVar8,
                 (long)pcVar9 - (long)(pcVar10 + 1));
  iVar5 = String::scanf((String *)&local_e8,"%p",&local_168);
  if (((local_e8._end.item)->key)._data.capacity != 0) {
    LOCK();
    puVar1 = &((local_e8._end.item)->key)._data.capacity;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_e8._end.item != (Item *)0x0)) {
      operator_delete__(local_e8._end.item);
    }
  }
  if (iVar5 == 1) {
    pcVar8 = (local_160.data)->str + (local_160.data)->len;
    do {
      pcVar8 = pcVar8 + -1;
      pcVar11 = (char *)0x0;
      if (pcVar8 < (local_160.data)->str) break;
      pcVar11 = pcVar8;
    } while (*pcVar8 != '(');
    if (pcVar11 != (char *)0x0) {
      pcVar8 = String::operator_cast_to_char_(&local_160);
      uVar12 = (long)pcVar11 - (long)pcVar8;
      uVar2 = (local_160.data)->len;
      length = uVar2;
      if (uVar12 < uVar2) {
        length = uVar12;
      }
      if ((long)uVar12 < 0) {
        length = uVar2;
      }
      String::String(&local_110,(local_160.data)->str,length);
      pcVar8 = String::operator_cast_to_char_(&local_110);
      String::fromPrintf(&local_138,"addr2line -e \"%s\" %p",pcVar8,local_168);
      Process::Process(&local_1a0);
      local_e8._end.item = &local_e8.endItem;
      local_e8.root = (Item *)0x0;
      local_e8._size = 0;
      local_e8.endItem.key.data = &String::emptyData.super_Data;
      local_e8.endItem.value.data = &String::emptyData.super_Data;
      local_e8.endItem.parent = (Item *)0x0;
      local_e8.endItem.next = (Item *)0x0;
      local_e8.endItem.prev = (Item *)0x0;
      local_e8.freeItem = (Item *)0x0;
      local_e8.blocks = (ItemBlock *)0x0;
      __nbytes = &local_e8;
      local_e8._begin.item = local_e8._end.item;
      iVar5 = Process::open(&local_1a0,(char *)&local_138,1);
      Map<String,_String>::~Map(&local_e8);
      if ((char)iVar5 == '\0') {
        bVar14 = false;
      }
      else {
        local_e8._end.item = (Item *)&String::emptyData;
        uVar7 = 0x8000;
        if (0x8000 < String::emptyData.super_Data.len) {
          uVar7 = String::emptyData.super_Data.len;
        }
        String::detach((String *)&local_e8,String::emptyData.super_Data.len,uVar7);
        pcVar8 = ((local_e8._end.item)->key)._data.str;
        String::detach((String *)&local_e8,(usize)pcVar8,(usize)pcVar8);
        uVar7 = Process::read(&local_1a0,(int)((local_e8._end.item)->key).data,(void *)0x8000,
                              (size_t)__nbytes);
        if ((long)uVar7 < 0) {
LAB_001048c6:
          bVar14 = false;
        }
        else {
          String::detach((String *)&local_e8,uVar7,uVar7);
          pDVar3 = ((local_e8._end.item)->key).data;
          pDVar6 = (Data *)(((local_e8._end.item)->key)._data.str + (long)&pDVar3->str);
          do {
            pDVar6 = (Data *)((long)&pDVar6[-1].ref + 7);
            pDVar13 = (Data *)0x0;
            if (pDVar6 < pDVar3) break;
            pDVar13 = pDVar6;
          } while (*(char *)&pDVar6->str != ':');
          if (pDVar13 == (Data *)0x0) goto LAB_001048c6;
          pcVar8 = String::operator_cast_to_char_((String *)&local_e8);
          String::substr(&local_190,(String *)&local_e8,0,(long)pDVar13 - (long)pcVar8);
          String::operator=(file,&local_190);
          if ((local_190.data)->ref != 0) {
            LOCK();
            puVar1 = &(local_190.data)->ref;
            *puVar1 = *puVar1 - 1;
            UNLOCK();
            if ((*puVar1 == 0) && (local_190.data != (Data *)0x0)) {
              operator_delete__(local_190.data);
            }
          }
          pcVar8 = String::operator_cast_to_char_((String *)&local_e8);
          String::substr(&local_190,(String *)&local_e8,(long)pDVar13 + (1 - (long)pcVar8),-1);
          iVar5 = String::scanf(&local_190,"%d",line);
          bVar14 = iVar5 == 1;
          if ((local_190.data)->ref != 0) {
            LOCK();
            puVar1 = &(local_190.data)->ref;
            *puVar1 = *puVar1 - 1;
            UNLOCK();
            if ((*puVar1 == 0) && (local_190.data != (Data *)0x0)) {
              operator_delete__(local_190.data);
            }
          }
        }
        if (((local_e8._end.item)->key)._data.capacity != 0) {
          LOCK();
          puVar1 = &((local_e8._end.item)->key)._data.capacity;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (local_e8._end.item != (Item *)0x0)) {
            operator_delete__(local_e8._end.item);
          }
        }
      }
      Process::~Process(&local_1a0);
      if ((local_138.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_138.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_138.data != (Data *)0x0)) {
          operator_delete__(local_138.data);
        }
      }
      if ((local_110.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_110.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_110.data != (Data *)0x0)) {
          operator_delete__(local_110.data);
        }
      }
      goto LAB_0010489e;
    }
  }
  bVar14 = false;
LAB_0010489e:
  if ((local_160.data)->ref == 0) {
    return bVar14;
  }
  LOCK();
  puVar1 = &(local_160.data)->ref;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if (*puVar1 == 0) {
    if (local_160.data != (Data *)0x0) {
      operator_delete__(local_160.data);
      return bVar14;
    }
    return bVar14;
  }
  return bVar14;
}

Assistant:

bool Debug::getSourceLine(void* addr, String& file, int& line)
{
#ifdef _WIN32
  typedef BOOL (WINAPI *PSymInitialize)(HANDLE hProcess, PCSTR UserSearchPath, BOOL fInvadeProcess);
  typedef BOOL (WINAPI *PSymGetLineFromAddr64)(HANDLE hProcess, DWORD64 qwAddr, PDWORD pdwDisplacement, PIMAGEHLP_LINE64 Line64);
  static PSymInitialize pSymInitialize = 0;
  static PSymGetLineFromAddr64 pSymGetLineFromAddr64 = 0;
  static bool initialized = false;
  HANDLE hProcess = GetCurrentProcess();
  if(!initialized)
  {
    initialized = true;
    HMODULE hModule = LoadLibrary("Dbghelp.dll");
    if(!hModule)
      return false;
    pSymInitialize = (PSymInitialize)GetProcAddress(hModule, "SymInitialize");
    pSymGetLineFromAddr64 = (PSymGetLineFromAddr64)GetProcAddress(hModule, "SymGetLineFromAddr64");
    if(!pSymInitialize || !pSymGetLineFromAddr64)
      return false;
    if(!pSymInitialize(hProcess, NULL, TRUE))
    {
      pSymGetLineFromAddr64 = 0;
      return false;
    }
  }
  if(!pSymGetLineFromAddr64)
    return false;
  IMAGEHLP_LINE64 ihLine;
  ihLine.SizeOfStruct = sizeof(IMAGEHLP_LINE64);
  DWORD displacement;
  if(!pSymGetLineFromAddr64(hProcess, (DWORD64)addr, &displacement, &ihLine))
    return false;
#ifdef UNICODE
  static wchar_t fileName[MAX_PATH];
  size_t len = mbstowcs(fileName, ihLine.FileName, strlen(ihLine.FileName));
  if(len == -1)
      return false;
  file = String(fileName, len);
#else
  file = String::fromCString(ihLine.FileName);
#endif
  line = ihLine.LineNumber;
  return true;
#else
  void* addrs[1];
  addrs[0] = addr;
  char** addrStrs = backtrace_symbols(addrs, 1);
  if(!addrStrs)
      return false;
  if(!*addrStrs)
  {
      free(addrStrs);
      return false;
  }
  String addrStr = String::fromCString(*addrStrs);
  free(addrStrs);
  const char* addrStart = addrStr.findLast('[');
  const char* addrEnd = addrStr.findLast(']');
  if(!addrStart ||!addrEnd || addrEnd < addrStart)
      return false;
  ++addrStart;
  void* relAddr;
  if(addrStr.substr(addrStart - (const char*)addrStr, addrEnd - addrStart).scanf("%p", &relAddr) != 1)
      return false;
  const char* binaryEnd = addrStr.findLast('(');
  if(!binaryEnd)
      return false;
  String bin = addrStr.substr(0, binaryEnd - (const char*)addrStr);
  String cmd = String::fromPrintf("addr2line -e \"%s\" %p", (const char*)bin, relAddr);
  Process process;
  if(!process.open(cmd))
      return false;
  String buf;
  buf.reserve(1024 * 32);
  ssize i = process.read((char*)buf, 1024 * 32);
  if(i < 0)
    return false;
  buf.resize(i);
  const char* fileEnd = buf.findLast(':');
  if(!fileEnd)
      return false;
  file = buf.substr(0, fileEnd - (const char*)buf);
  if(buf.substr(fileEnd - (const char*)buf + 1).scanf("%d", &line) != 1)
      return false;
  return true;
#endif
}